

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transactions.cpp
# Opt level: O0

RPCHelpMan * wallet::rescanblockchain(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff598;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff5a0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d0;
  UniValue *in_stack_fffffffffffff5d8;
  iterator in_stack_fffffffffffff5e0;
  RPCArgOptions *in_stack_fffffffffffff5e8;
  string *in_stack_fffffffffffff5f0;
  Fallback *in_stack_fffffffffffff5f8;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff600;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff608;
  RPCArg *in_stack_fffffffffffff610;
  string *psVar3;
  RPCResults *in_stack_fffffffffffff618;
  string *psVar4;
  RPCResult *in_stack_fffffffffffff620;
  RPCResults *results;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 uVar5;
  RPCHelpMan *this_00;
  allocator<char> local_88d;
  allocator<char> local_88c;
  allocator<char> local_88b;
  allocator<char> local_88a [2];
  pointer local_888;
  pointer pRStack_880;
  pointer local_878;
  allocator<char> local_86a;
  allocator<char> local_869 [31];
  allocator<char> local_84a;
  allocator<char> local_849 [31];
  allocator<char> local_82a;
  allocator<char> local_829 [32];
  allocator<char> local_809;
  undefined4 local_808;
  allocator<char> local_802;
  allocator<char> local_801;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff804;
  allocator<char> local_7da;
  RPCResults local_7d9 [16];
  string local_658 [4];
  string local_5d0 [4];
  string local_548 [6];
  undefined1 local_480;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_398;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined1 local_358;
  undefined1 local_357;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  results = local_7d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  uVar6 = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff5d8,(int *)in_stack_fffffffffffff5d0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  local_398 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff5b0);
  local_370 = 0;
  uStack_368 = 0;
  local_360 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff598);
  local_358 = 0;
  local_357 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                 (Type)((ulong)in_stack_fffffffffffff600 >> 0x20),in_stack_fffffffffffff5f8,
                 in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  local_808 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff5a8,&in_stack_fffffffffffff5a0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  local_480 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff5b0);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff598);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff610,in_stack_fffffffffffff608,
                 (Type)((ulong)in_stack_fffffffffffff600 >> 0x20),in_stack_fffffffffffff5f8,
                 in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff5f8 >> 0x38);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff598);
  __l._M_len = (size_type)in_stack_fffffffffffff5e8;
  __l._M_array = in_stack_fffffffffffff5e0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5d8,__l,
             (allocator_type *)in_stack_fffffffffffff5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  local_869[1] = (allocator<char>)0x0;
  local_869[2] = (allocator<char>)0x0;
  local_869[3] = (allocator<char>)0x0;
  local_869[4] = (allocator<char>)0x0;
  local_869[5] = (allocator<char>)0x0;
  local_869[6] = (allocator<char>)0x0;
  local_869[7] = (allocator<char>)0x0;
  local_869[8] = (allocator<char>)0x0;
  local_869[9] = (allocator<char>)0x0;
  local_869[10] = (allocator<char>)0x0;
  local_869[0xb] = (allocator<char>)0x0;
  local_869[0xc] = (allocator<char>)0x0;
  local_869[0xd] = (allocator<char>)0x0;
  local_869[0xe] = (allocator<char>)0x0;
  local_869[0xf] = (allocator<char>)0x0;
  local_869[0x10] = (allocator<char>)0x0;
  local_869[0x11] = (allocator<char>)0x0;
  local_869[0x12] = (allocator<char>)0x0;
  local_869[0x13] = (allocator<char>)0x0;
  local_869[0x14] = (allocator<char>)0x0;
  local_869[0x15] = (allocator<char>)0x0;
  local_869[0x16] = (allocator<char>)0x0;
  local_869[0x17] = (allocator<char>)0x0;
  local_869[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff598);
  RPCResult::RPCResult
            (in_stack_fffffffffffff620,(Type)((ulong)in_stack_fffffffffffff618 >> 0x20),
             &in_stack_fffffffffffff610->m_names,in_stack_fffffffffffff608,in_stack_fffffffffffff600
             ,(bool)skip_type_check);
  psVar4 = local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  local_888 = (pointer)0x0;
  pRStack_880 = (pointer)0x0;
  local_878 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff598);
  RPCResult::RPCResult
            (in_stack_fffffffffffff620,(Type)((ulong)in_stack_fffffffffffff618 >> 0x20),
             &in_stack_fffffffffffff610->m_names,in_stack_fffffffffffff608,in_stack_fffffffffffff600
             ,(bool)skip_type_check);
  uVar5 = 0;
  psVar3 = local_658;
  this_00 = (RPCHelpMan *)0x2;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff598);
  __l_00._M_len = (size_type)in_stack_fffffffffffff5e8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff5e0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8,__l_00,
             (allocator_type *)in_stack_fffffffffffff5d0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff620,(Type)((ulong)in_stack_fffffffffffff618 >> 0x20),
             &in_stack_fffffffffffff610->m_names,in_stack_fffffffffffff608,in_stack_fffffffffffff600
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff618,(RPCResult *)in_stack_fffffffffffff610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  HelpExampleCli(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5e8,(char *)in_stack_fffffffffffff5e0,
             (allocator<char> *)in_stack_fffffffffffff5d8);
  HelpExampleRpc(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  std::operator+(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff598,(string *)0x5c4e64);
  this = (RPCArg *)&stack0xfffffffffffff750;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::rescanblockchain()::__0,void>
            (in_stack_fffffffffffff5a8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff5a0);
  RPCHelpMan::RPCHelpMan
            (this_00,psVar3,psVar4,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)CONCAT17(uVar5,in_stack_fffffffffffff6f0),
             results,(RPCExamples *)in_RDI,
             (RPCMethodImpl *)CONCAT44(in_stack_fffffffffffff804,uVar6));
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_88a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5a8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  psVar4 = local_658;
  psVar3 = local_548;
  do {
    psVar3 = (string *)((long)&psVar3[-5].field_2 + 8);
    RPCResult::~RPCResult((RPCResult *)this);
  } while (psVar3 != psVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_86a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_869);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5a8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_84a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_849);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_82a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_829);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5a8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_809);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_802);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_801);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff807);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7d9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan rescanblockchain()
{
    return RPCHelpMan{"rescanblockchain",
                "\nRescan the local blockchain for wallet related transactions.\n"
                "Note: Use \"getwalletinfo\" to query the scanning progress.\n"
                "The rescan is significantly faster when used on a descriptor wallet\n"
                "and block filters are available (using startup option \"-blockfilterindex=1\").\n",
                {
                    {"start_height", RPCArg::Type::NUM, RPCArg::Default{0}, "block height where the rescan should start"},
                    {"stop_height", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "the last block height that should be scanned. If none is provided it will rescan up to the tip at return time of this call."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM, "start_height", "The block height where the rescan started (the requested height or 0)"},
                        {RPCResult::Type::NUM, "stop_height", "The height of the last rescanned block. May be null in rare cases if there was a reorg and the call didn't scan any blocks because they were already scanned in the background."},
                    }
                },
                RPCExamples{
                    HelpExampleCli("rescanblockchain", "100000 120000")
            + HelpExampleRpc("rescanblockchain", "100000, 120000")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;
    CWallet& wallet{*pwallet};

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    WalletRescanReserver reserver(*pwallet);
    if (!reserver.reserve(/*with_passphrase=*/true)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
    }

    int start_height = 0;
    std::optional<int> stop_height;
    uint256 start_block;

    LOCK(pwallet->m_relock_mutex);
    {
        LOCK(pwallet->cs_wallet);
        EnsureWalletIsUnlocked(*pwallet);
        int tip_height = pwallet->GetLastBlockHeight();

        if (!request.params[0].isNull()) {
            start_height = request.params[0].getInt<int>();
            if (start_height < 0 || start_height > tip_height) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid start_height");
            }
        }

        if (!request.params[1].isNull()) {
            stop_height = request.params[1].getInt<int>();
            if (*stop_height < 0 || *stop_height > tip_height) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid stop_height");
            } else if (*stop_height < start_height) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "stop_height must be greater than start_height");
            }
        }

        // We can't rescan beyond non-pruned blocks, stop and throw an error
        if (!pwallet->chain().hasBlocks(pwallet->GetLastBlockHash(), start_height, stop_height)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Can't rescan beyond pruned data. Use RPC call getblockchaininfo to determine your pruned height.");
        }

        CHECK_NONFATAL(pwallet->chain().findAncestorByHeight(pwallet->GetLastBlockHash(), start_height, FoundBlock().hash(start_block)));
    }

    CWallet::ScanResult result =
        pwallet->ScanForWalletTransactions(start_block, start_height, stop_height, reserver, /*fUpdate=*/true, /*save_progress=*/false);
    switch (result.status) {
    case CWallet::ScanResult::SUCCESS:
        break;
    case CWallet::ScanResult::FAILURE:
        throw JSONRPCError(RPC_MISC_ERROR, "Rescan failed. Potentially corrupted data files.");
    case CWallet::ScanResult::USER_ABORT:
        throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted.");
        // no default case, so the compiler can warn about missing cases
    }
    UniValue response(UniValue::VOBJ);
    response.pushKV("start_height", start_height);
    response.pushKV("stop_height", result.last_scanned_height ? *result.last_scanned_height : UniValue());
    return response;
},
    };
}